

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_serial_dump.cpp
# Opt level: O0

vector<interface,_std::allocator<interface>_> *
parse_interfaces(vector<interface,_std::allocator<interface>_> *__return_storage_ptr__,
                variables_map *variables)

{
  variables_map *this;
  bool bVar1;
  variable_value *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  runtime_error *this_02;
  interface local_c8;
  reference local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  const_iterator __end1;
  const_iterator __begin1;
  allocator local_49;
  string local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  variables_map *local_18;
  variables_map *variables_local;
  vector<interface,_std::allocator<interface>_> *result;
  
  __range1._7_1_ = 0;
  local_18 = variables;
  variables_local = (variables_map *)__return_storage_ptr__;
  std::vector<interface,_std::allocator<interface>_>::vector(__return_storage_ptr__);
  this = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"interface",&local_49);
  this_00 = boost::program_options::variables_map::operator[](this,&local_48);
  this_01 = boost::program_options::variable_value::
            as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(this_00);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_28 = this_01;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_01);
  config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&config), bVar1) {
    local_78 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    interface::interface(&local_c8,local_78);
    std::vector<interface,_std::allocator<interface>_>::push_back(__return_storage_ptr__,&local_c8);
    interface::~interface(&local_c8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::vector<interface,_std::allocator<interface>_>::empty(__return_storage_ptr__);
  if (bVar1) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"no interface defined");
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< interface > parse_interfaces( const po::variables_map& variables )
{
    std::vector< interface > result;

    for ( const auto& config : variables[ "interface" ].as< std::vector< std::string > >() )
        result.push_back( interface( config ) );

    if ( result.empty() )
        throw std::runtime_error( "no interface defined" );

    return result;
}